

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
  *this_00;
  ParseInfoTree *instance;
  ParseInfoTree *local_20;
  FieldDescriptor *local_18;
  
  local_18 = field;
  local_20 = (ParseInfoTree *)operator_new(0x60);
  p_Var1 = &(local_20->locations_)._M_t._M_impl.super__Rb_tree_header;
  (local_20->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_20->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_20->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (local_20->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (local_20->locations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(local_20->nested_)._M_t._M_impl.super__Rb_tree_header;
  (local_20->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_20->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_20->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (local_20->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (local_20->nested_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = (vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
             *)std::
               map<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>_>_>
               ::operator[](&this->nested_,&local_18);
  __position._M_current = *(ParseInfoTree ***)(this_00 + 8);
  if (__position._M_current == *(ParseInfoTree ***)(this_00 + 0x10)) {
    std::
    vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>
    ::_M_realloc_insert<google::protobuf::TextFormat::ParseInfoTree*const&>
              (this_00,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  return local_20;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  TextFormat::ParseInfoTree* instance = new TextFormat::ParseInfoTree();
  vector<TextFormat::ParseInfoTree*>* trees = &nested_[field];
  GOOGLE_CHECK(trees);
  trees->push_back(instance);
  return instance;
}